

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int vorbis_finish_frame(stb_vorbis *f,int len,int left,int right)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = f->previous_length;
  if (uVar1 == 0) {
    uVar5 = 0;
    if (0 < f->channels) {
      uVar5 = (ulong)(uint)f->channels;
    }
  }
  else {
    lVar4 = 0x5b8;
    if ((uVar1 * 2 != f->blocksize_0) && (lVar4 = 0x5c0, uVar1 * 2 != f->blocksize_1)) {
      return 0;
    }
    lVar4 = *(long *)((long)&f->sample_rate + lVar4);
    if (lVar4 == 0) {
      return 0;
    }
    uVar6 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    uVar5 = (ulong)(uint)f->channels;
    if (f->channels < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      uVar2 = uVar1;
      for (uVar7 = 0; uVar2 = uVar2 - 1, uVar3 != uVar7; uVar7 = uVar7 + 1) {
        f->channel_buffers[uVar6][(long)left + uVar7] =
             f->channel_buffers[uVar6][(long)left + uVar7] * *(float *)(lVar4 + uVar7 * 4) +
             f->previous_window[uVar6][uVar7] * *(float *)(lVar4 + (long)(int)uVar2 * 4);
      }
    }
  }
  f->previous_length = len - right;
  for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    for (lVar4 = 0; right + lVar4 < (long)len; lVar4 = lVar4 + 1) {
      f->previous_window[uVar3][lVar4] = f->channel_buffers[uVar3][right + lVar4];
    }
  }
  if (uVar1 == 0) {
    return 0;
  }
  if (len < right) {
    right = len;
  }
  f->samples_output = f->samples_output + (right - left);
  return right - left;
}

Assistant:

static int vorbis_finish_frame(stb_vorbis *f, int len, int left, int right)
{
   int prev,i,j;
   // we use right&left (the start of the right- and left-window sin()-regions)
   // to determine how much to return, rather than inferring from the rules
   // (same result, clearer code); 'left' indicates where our sin() window
   // starts, therefore where the previous window's right edge starts, and
   // therefore where to start mixing from the previous buffer. 'right'
   // indicates where our sin() ending-window starts, therefore that's where
   // we start saving, and where our returned-data ends.

   // mixin from previous window
   if (f->previous_length) {
      int i,j, n = f->previous_length;
      float *w = get_window(f, n);
      if (w == NULL) return 0;
      for (i=0; i < f->channels; ++i) {
         for (j=0; j < n; ++j)
            f->channel_buffers[i][left+j] =
               f->channel_buffers[i][left+j]*w[    j] +
               f->previous_window[i][     j]*w[n-1-j];
      }
   }

   prev = f->previous_length;

   // last half of this data becomes previous window
   f->previous_length = len - right;

   // @OPTIMIZE: could avoid this copy by double-buffering the
   // output (flipping previous_window with channel_buffers), but
   // then previous_window would have to be 2x as large, and
   // channel_buffers couldn't be temp mem (although they're NOT
   // currently temp mem, they could be (unless we want to level
   // performance by spreading out the computation))
   for (i=0; i < f->channels; ++i)
      for (j=0; right+j < len; ++j)
         f->previous_window[i][j] = f->channel_buffers[i][right+j];

   if (!prev)
      // there was no previous packet, so this data isn't valid...
      // this isn't entirely true, only the would-have-overlapped data
      // isn't valid, but this seems to be what the spec requires
      return 0;

   // truncate a short frame
   if (len < right) right = len;

   f->samples_output += right-left;

   return right - left;
}